

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

ssize_t extract_pack_stream(archive_read *a,size_t minimum)

{
  size_t *psVar1;
  uint64_t *puVar2;
  byte bVar3;
  _7zip *zip;
  uint uVar4;
  lzma_ret lVar5;
  Bool BVar6;
  uint32_t uVar7;
  uchar *puVar8;
  uchar *puVar9;
  Bytef *__src;
  ssize_t sVar10;
  unsigned_long uVar11;
  void *pvVar12;
  ulong uVar13;
  byte bVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  uint64_t uVar18;
  long lVar19;
  size_t sVar20;
  char *pcVar21;
  long lVar22;
  ulong uVar23;
  uchar *puVar24;
  long lVar25;
  ulong uVar26;
  uchar *puVar27;
  uchar *puVar28;
  ulong uVar29;
  uint uVar30;
  size_t sVar31;
  ulong uVar32;
  ulong uVar33;
  size_t sVar34;
  long lVar35;
  uchar *puVar36;
  size_t sVar37;
  bool bVar38;
  bool bVar39;
  size_t sVar40;
  ZSTD_inBuffer input;
  ulong local_100;
  ulong local_e0;
  int local_d8;
  int local_d4;
  bz_stream *local_d0;
  lzma_stream *local_c8;
  CPpmd7z_RangeDec *local_c0;
  size_t local_b8;
  long local_b0;
  ulong local_a8;
  long local_a0;
  uchar *local_98;
  code *local_90;
  IByteIn *local_88;
  z_streamp local_80;
  size_t local_78;
  CPpmd7 *local_70;
  code *local_68;
  ZSTD_outBuffer local_60;
  ZSTD_inBuffer local_48;
  
  zip = (_7zip *)a->format->data;
  if ((zip->codec == 0) && (zip->codec2 == 0xffffffffffffffff)) {
    pvVar12 = __archive_read_ahead(a,minimum + (minimum == 0),(ssize_t *)&local_e0);
    if (0 < (long)local_e0 && pvVar12 != (void *)0x0) {
      uVar32 = zip->folder_outbytes_remaining;
      uVar26 = zip->pack_stream_inbytes_remaining;
      if (uVar26 <= local_e0) {
        local_e0 = uVar26;
      }
      zip->pack_stream_inbytes_remaining = uVar26 - local_e0;
      if (uVar32 <= local_e0) {
        local_e0 = uVar32;
      }
      zip->folder_outbytes_remaining = uVar32 - local_e0;
      zip->uncompressed_buffer_bytes_remaining = local_e0;
      return 0;
    }
  }
  else {
    puVar9 = zip->uncompressed_buffer;
    if (puVar9 == (uchar *)0x0) {
      sVar20 = 0x10000;
      if (0x10000 < minimum) {
        sVar20 = minimum + 0x3ff & 0xfffffffffffffc00;
      }
      zip->uncompressed_buffer_size = sVar20;
      puVar9 = (uchar *)malloc(sVar20);
      zip->uncompressed_buffer = puVar9;
      if (puVar9 == (uchar *)0x0) {
LAB_0066146f:
        pcVar21 = "No memory for 7-Zip decompression";
        iVar17 = 0xc;
        goto LAB_00661474;
      }
LAB_0066076d:
      zip->uncompressed_buffer_bytes_remaining = 0;
    }
    else if (zip->uncompressed_buffer_size < minimum) {
      puVar36 = zip->uncompressed_buffer_pointer;
      uVar32 = minimum + 0x3ff & 0xfffffffffffffc00;
      puVar8 = (uchar *)realloc(puVar9,uVar32);
      if (puVar8 == (uchar *)0x0) goto LAB_0066146f;
      lVar22 = (long)puVar36 - (long)puVar9;
      if (puVar36 == (uchar *)0x0) {
        lVar22 = 0;
      }
      zip->uncompressed_buffer = puVar8;
      zip->uncompressed_buffer_size = uVar32;
      puVar9 = puVar8;
LAB_00660754:
      if (lVar22 != 0) {
        memmove(puVar9,puVar9 + lVar22,zip->uncompressed_buffer_bytes_remaining);
      }
    }
    else {
      if (minimum <= zip->uncompressed_buffer_bytes_remaining) goto LAB_0066076d;
      if (zip->uncompressed_buffer_pointer != (uchar *)0x0) {
        lVar22 = (long)zip->uncompressed_buffer_pointer - (long)puVar9;
        goto LAB_00660754;
      }
    }
    zip->uncompressed_buffer_pointer = (uchar *)0x0;
    local_78 = minimum;
    __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_e0);
    if (0 < (long)local_e0) {
      local_98 = zip->odd_bcj;
      local_88 = &zip->bytein;
      local_c0 = &zip->range_dec;
      local_90 = Ppmd7z_RangeDec_Init;
      local_68 = Ppmd7_DecodeSymbol;
      local_70 = &zip->ppmd7_context;
      local_80 = &zip->stream;
      local_d0 = &zip->bzstream;
      local_c8 = &zip->lzstream;
      do {
        puVar36 = zip->uncompressed_buffer;
        sVar37 = zip->uncompressed_buffer_size;
        sVar34 = zip->uncompressed_buffer_bytes_remaining;
        puVar9 = puVar36 + sVar34;
        uVar33 = sVar37 - sVar34;
        uVar32 = zip->pack_stream_inbytes_remaining;
        uVar26 = local_e0;
        if (uVar32 <= local_e0) {
          uVar26 = uVar32;
        }
        uVar11 = zip->codec2;
        sVar40 = uVar33;
        puVar8 = puVar9;
        if (uVar11 != 0x3030103 || zip->codec == 0x21) {
LAB_0066092c:
          sVar37 = sVar40;
          puVar24 = puVar8;
          if (uVar11 == 0x303011b) {
            sVar31 = zip->tmp_stream_bytes_remaining;
            if (sVar31 == 0) {
LAB_006609c4:
              sVar40 = zip->tmp_stream_buff_size;
              puVar24 = zip->tmp_stream_buff;
              goto LAB_006609df;
            }
            sVar10 = Bcj2_Decode(zip,puVar8,sVar40);
            if (-1 < sVar10) {
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining + (zip->tmp_stream_bytes_remaining - sVar31);
              sVar37 = sVar40 - sVar10;
              if ((uVar32 == 0) || (sVar37 == 0)) {
                uVar23 = uVar33 - sVar37;
                if (uVar32 == 0) {
                  uVar4 = (uint)(zip->tmp_stream_bytes_remaining != 0);
                }
                else {
                  uVar4 = 0;
                }
                sVar31 = 0;
                goto LAB_00660db6;
              }
              puVar8 = puVar8 + sVar10;
              goto LAB_006609c4;
            }
            pcVar21 = "BCJ2 conversion Failed";
            goto LAB_0066145c;
          }
LAB_006609df:
          uVar11 = zip->codec;
          if ((long)uVar11 < 0x30401) {
            if (uVar11 == 0) {
              uVar23 = sVar40;
              if (uVar26 < sVar40) {
                uVar23 = uVar26;
              }
              memcpy(puVar24,__src,uVar23);
              sVar31 = uVar26 - uVar23;
              sVar40 = sVar40 - uVar23;
              uVar29 = (ulong)(uVar32 == 0);
            }
            else {
              if ((uVar11 != 0x21) && (uVar11 != 0x30101)) goto LAB_00661514;
              (zip->lzstream).next_in = __src;
              (zip->lzstream).avail_in = uVar26;
              (zip->lzstream).next_out = puVar24;
              (zip->lzstream).avail_out = sVar40;
              lVar5 = lzma_code(local_c8,LZMA_RUN);
              uVar29 = (ulong)lVar5;
              if (lVar5 != LZMA_OK) {
                if (lVar5 != LZMA_STREAM_END) {
                  pcVar21 = "Decompression failed(%d)";
                  goto LAB_00661541;
                }
                lzma_end(local_c8);
                zip->lzstream_valid = 0;
              }
              sVar31 = (zip->lzstream).avail_in;
              sVar40 = (zip->lzstream).avail_out;
            }
LAB_00660d0d:
            uVar23 = uVar33 - sVar40;
            uVar4 = (uint)uVar29;
            if (zip->codec == 0x21) {
LAB_00660d2b:
              uVar11 = zip->codec2;
            }
            else {
              uVar11 = zip->codec2;
              if (uVar11 == 10) {
                if (uVar23 < 4) {
                  uVar29 = 0;
                }
                else {
                  uVar32 = 0;
                  do {
                    bVar14 = puVar36[uVar32 + sVar34];
                    uVar15 = (uint)puVar36[uVar32 + sVar34 + 2] << 0x10 |
                             (uint)puVar36[uVar32 + sVar34 + 1] << 8;
                    uVar16 = uVar15 | bVar14;
                    bVar3 = puVar36[uVar32 + sVar34 + 3];
                    if ((bVar3 & 0xfc) == 0x94) {
                      iVar17 = (uVar16 | (uint)bVar3 << 0x18) - (zip->bcj_ip + (int)uVar32 >> 2);
                      puVar36[uVar32 + sVar34] = (uchar)iVar17;
                      puVar36[uVar32 + sVar34 + 1] = (uchar)((uint)iVar17 >> 8);
                      puVar36[uVar32 + sVar34 + 2] = (uchar)((uint)iVar17 >> 0x10);
                      bVar14 = (byte)((uint)iVar17 >> 0x18) & 3 | 0x94;
LAB_00660ffc:
                      puVar36[uVar32 + sVar34 + 3] = bVar14;
                    }
                    else if (((bVar3 & 0x9f) == 0x90) && (((uVar16 >> 3) + 0x20000 & 0x1c0000) == 0)
                            ) {
                      uVar16 = (bVar3 >> 5 & 3 | (uVar15 | bVar14 & 0xffffffe0) >> 3) -
                               (zip->bcj_ip + (int)uVar32 >> 0xc);
                      uVar15 = uVar16 * 8 & 0x1fffe0;
                      puVar36[uVar32 + sVar34] = bVar14 & 0x1f | (byte)uVar15;
                      puVar36[uVar32 + sVar34 + 1] = (uchar)(uVar16 >> 5);
                      puVar36[uVar32 + sVar34 + 2] =
                           (byte)(-(uVar16 & 0x20000) >> 0x10) & 0xe0 | (byte)(uVar15 >> 0x10);
                      bVar14 = (char)uVar16 << 5 | 0x90;
                      goto LAB_00660ffc;
                    }
                    uVar29 = uVar32 + 4;
                    uVar13 = uVar32 + 8;
                    uVar32 = uVar29;
                  } while (uVar13 <= uVar23);
                }
                zip->bcj_ip = zip->bcj_ip + (int)uVar29;
                uVar23 = uVar29;
                goto LAB_00660d2b;
              }
              if (uVar11 == 0x3030501) {
                if (uVar23 < 4) {
                  uVar23 = 0;
                }
                else {
                  uVar32 = 4;
                  lVar22 = 0;
                  do {
                    if (puVar9[uVar32 - 1] == 0xeb) {
                      uVar15 = ((((uint)puVar9[uVar32 - 3] << 10 | (uint)puVar9[uVar32 - 2] << 0x12)
                                + (uint)puVar9[uVar32 - 4] * 4) - zip->bcj_ip) + (int)lVar22;
                      puVar9[uVar32 - 4] = (uchar)(uVar15 >> 2);
                      puVar9[uVar32 - 3] = (uchar)(uVar15 >> 10);
                      puVar9[uVar32 - 2] = (uchar)(uVar15 >> 0x12);
                    }
                    uVar32 = uVar32 + 4;
                    lVar22 = lVar22 + -4;
                  } while (uVar32 <= uVar23);
                  uVar23 = -lVar22;
                }
                zip->bcj_ip = zip->bcj_ip + (int)uVar23;
                goto LAB_00660d2b;
              }
              if (uVar11 == 0x3030103) {
                if (uVar23 < 5) {
                  uVar29 = 0;
                }
                else {
                  puVar36 = (uchar *)zip->bcj_prevPosT;
                  uVar7 = zip->bcj_prevMask;
                  puVar27 = puVar9 + (uVar23 - 4);
                  puVar24 = puVar9;
                  if (puVar9 < puVar27) {
                    lVar22 = -(long)puVar9;
                    uVar15 = (uint)puVar9;
                    local_d4 = uVar15 - zip->bcj_ip;
                    local_d8 = (uVar15 - zip->bcj_ip) + -1;
                    local_a8 = (ulong)~uVar15;
                    do {
                      puVar28 = puVar24;
                      lVar25 = 0;
                      while ((puVar28[lVar25] & 0xfe) != 0xe8) {
                        lVar35 = lVar25 + 1;
                        lVar25 = lVar25 + 1;
                        if (puVar27 <= puVar28 + lVar35) {
                          puVar24 = puVar28 + lVar25;
                          goto LAB_00661384;
                        }
                      }
                      lVar35 = lVar22 + (long)puVar28;
                      local_100 = 0;
                      if ((ulong)((lVar35 - (long)puVar36) + lVar25) < 4) {
                        uVar7 = uVar7 << ((char)lVar25 +
                                          (((char)~uVar15 + (char)puVar28) - (char)puVar36) & 0x1fU)
                                & 7;
                        if ((uVar7 == 0) ||
                           (((0xe8U >> uVar7 & 1) == 0 &&
                            (local_100 = (ulong)uVar7,
                            (byte)(puVar28[lVar25 + (4 - (ulong)*(byte *)((long)&
                                                  x86_Convert_kMaskToBitNumber + (ulong)uVar7))] - 1
                                  ) < 0xfe)))) goto LAB_00661192;
LAB_0066128d:
                        uVar7 = (uVar7 & 3) * 2 + 1;
                        lVar19 = 1;
                      }
                      else {
LAB_00661192:
                        bVar14 = puVar28[lVar25 + 4];
                        uVar7 = (uint32_t)local_100;
                        if ((bVar14 != 0xff) && (bVar14 != 0)) goto LAB_0066128d;
                        uVar29 = ((ulong)(uint)(local_d4 - (int)puVar28) +
                                 (ulong)((uint)puVar28[lVar25 + 1] |
                                        (uint)puVar28[lVar25 + 2] << 8 |
                                        (uint)puVar28[lVar25 + 3] << 0x10 | (uint)bVar14 << 0x18)) -
                                 lVar25;
                        uVar16 = (uint)uVar29;
                        if (uVar7 != 0) {
                          while( true ) {
                            uVar16 = (uint)uVar29;
                            uVar30 = uVar16 >> (*(char *)((long)&x86_Convert_kMaskToBitNumber +
                                                         local_100) * -8 + 0x18U & 0x1f);
                            if (((char)uVar30 != -1) && (local_b8 = sVar40, (uVar30 & 0xff) != 0))
                            break;
                            uVar29 = (ulong)(((local_d8 - (int)puVar28) - (int)lVar25) -
                                            (uVar16 ^ -1 << (*(char *)((long)&
                                                  x86_Convert_kMaskToBitNumber + local_100) * -8 &
                                                  0x1fU)));
                          }
                        }
                        puVar28[lVar25 + 4] = (uchar)((int)(uVar16 << 7) >> 0x1f);
                        puVar28[lVar25 + 3] = (uchar)(uVar16 >> 0x10);
                        puVar28[lVar25 + 2] = (uchar)(uVar16 >> 8);
                        puVar28[lVar25 + 1] = (uchar)uVar16;
                        lVar19 = 5;
                        local_b0 = lVar35;
                      }
                      puVar36 = (uchar *)(lVar35 + lVar25);
                      puVar24 = puVar28 + lVar19 + lVar25;
                      local_a0 = lVar22;
                    } while (puVar28 + lVar19 + lVar25 < puVar27);
                    puVar36 = puVar28 + (lVar25 - (long)puVar9);
                    puVar24 = puVar28 + lVar25 + lVar19;
                  }
LAB_00661384:
                  uVar29 = (long)puVar24 - (long)puVar9;
                  zip->bcj_prevPosT = (size_t)puVar36;
                  zip->bcj_prevMask = uVar7;
                  zip->bcj_ip = zip->bcj_ip + (int)uVar29;
                }
                sVar20 = uVar23 - uVar29;
                zip->odd_bcj_size = sVar20;
                if ((((sVar20 == 0) || (uVar4 == 1)) || (4 < sVar20)) || (uVar32 == 0)) {
                  zip->odd_bcj_size = 0;
                }
                else {
                  memcpy(local_98,puVar9 + uVar29,sVar20);
                  uVar23 = uVar29;
                }
                goto LAB_00660d2b;
              }
            }
            if (uVar11 == 0x303011b) {
              uVar32 = zip->tmp_stream_buff_size - sVar40;
              if (zip->main_stream_bytes_remaining <= uVar32) {
                uVar32 = zip->main_stream_bytes_remaining;
              }
              zip->tmp_stream_bytes_avail = uVar32;
              zip->tmp_stream_bytes_remaining = uVar32;
              sVar10 = Bcj2_Decode(zip,puVar8,sVar37);
              if (sVar10 < 0) {
                pcVar21 = "BCJ2 conversion Failed";
                goto LAB_0066145c;
              }
              zip->main_stream_bytes_remaining =
                   zip->main_stream_bytes_remaining +
                   (zip->tmp_stream_bytes_remaining - zip->tmp_stream_bytes_avail);
              uVar23 = (uVar33 - sVar37) + sVar10;
            }
            if (1 < uVar4) {
              return -0x1e;
            }
            sVar31 = uVar26 - sVar31;
            goto LAB_00660db6;
          }
          if ((long)uVar11 < 0x40202) {
            if (uVar11 == 0x30401) {
              if (((zip->ppmd7_valid == 0) || (iVar17 = zip->ppmd7_stat, iVar17 < 0)) ||
                 (sVar40 == 0)) goto LAB_00661514;
              (zip->ppstream).next_in = __src;
              (zip->ppstream).avail_in = uVar26;
              (zip->ppstream).stream_in = 0;
              (zip->ppstream).next_out = puVar24;
              (zip->ppstream).avail_out = sVar40;
              if (iVar17 == 0) {
                (zip->bytein).a = a;
                (zip->bytein).Read = ppmd_read;
                (zip->range_dec).Stream = local_88;
                BVar6 = (*local_90)(local_c0);
                if (BVar6 == 0) {
                  zip->ppmd7_stat = -1;
                  pcVar21 = "Failed to initialize PPMd range decoder";
                  goto LAB_0066145c;
                }
                if ((zip->ppstream).overconsumed != 0) {
LAB_006614df:
                  zip->ppmd7_stat = -1;
                  return -0x1e;
                }
                zip->ppmd7_stat = 1;
              }
              if (uVar32 == 0) {
                uVar23 = zip->folder_outbytes_remaining;
              }
              else {
                uVar23 = 0;
              }
              do {
                uVar13 = uVar23;
                iVar17 = (*local_68)(local_70,&local_c0->p);
                if (iVar17 < 0) {
                  zip->ppmd7_stat = -1;
                  pcVar21 = "Failed to decode PPMd";
                  goto LAB_00661441;
                }
                if ((zip->ppstream).overconsumed != 0) goto LAB_006614df;
                puVar24 = (zip->ppstream).next_out;
                (zip->ppstream).next_out = puVar24 + 1;
                *puVar24 = (uchar)iVar17;
                sVar40 = (zip->ppstream).avail_out - 1;
                (zip->ppstream).avail_out = sVar40;
                (zip->ppstream).total_out = (zip->ppstream).total_out + 1;
                sVar31 = (zip->ppstream).avail_in;
                uVar29 = 0;
                if (sVar40 == 0) {
                  sVar40 = 0;
                  break;
                }
                uVar23 = uVar13 - 1;
                if (uVar13 == 0) {
                  uVar23 = uVar29;
                }
              } while ((sVar31 != 0) || (sVar31 = 0, 1 < uVar13));
            }
            else {
              if (uVar11 != 0x40108) {
LAB_00661514:
                pcVar21 = "Decompression internal error";
                goto LAB_0066145c;
              }
              (zip->stream).next_in = __src;
              (zip->stream).avail_in = (uInt)uVar26;
              (zip->stream).next_out = puVar24;
              (zip->stream).avail_out = (uInt)sVar40;
              uVar4 = cm_zlib_inflate(local_80,0);
              uVar29 = (ulong)uVar4;
              if (1 < uVar4) {
                pcVar21 = "File decompression failed (%d)";
LAB_00661541:
                archive_set_error(&a->archive,-1,pcVar21);
                return -0x1e;
              }
              sVar31 = (size_t)(zip->stream).avail_in;
              sVar40 = (size_t)(zip->stream).avail_out;
            }
            goto LAB_00660d0d;
          }
          if (uVar11 != 0x40202) {
            if (uVar11 != 0x4f71101) goto LAB_00661514;
            local_48.pos = 0;
            local_60.pos = 0;
            local_60.dst = puVar24;
            local_60.size = sVar40;
            local_48.src = __src;
            local_48.size = uVar26;
            sVar31 = ZSTD_decompressStream(zip->zstd_dstream,&local_60,&local_48);
            uVar4 = ZSTD_isError(sVar31);
            if (uVar4 != 0) {
              pcVar21 = ZSTD_getErrorName(sVar31);
              archive_set_error(&a->archive,-1,"Zstd decompression failed: %s",pcVar21);
              return -0x1e;
            }
            sVar31 = uVar26 - local_48.pos;
            sVar40 = sVar40 - local_60.pos;
            uVar29 = 0;
            goto LAB_00660d0d;
          }
          (zip->bzstream).next_in = (char *)__src;
          (zip->bzstream).avail_in = (uInt)uVar26;
          (zip->bzstream).next_out = (char *)puVar24;
          (zip->bzstream).avail_out = (uInt)sVar40;
          uVar4 = BZ2_bzDecompress(local_d0);
          uVar29 = (ulong)uVar4;
          if (uVar4 == 0) {
LAB_00660ccc:
            sVar31 = (size_t)(zip->bzstream).avail_in;
            sVar40 = (size_t)(zip->bzstream).avail_out;
            goto LAB_00660d0d;
          }
          if (uVar4 == 4) {
            iVar17 = BZ2_bzDecompressEnd(local_d0);
            if (iVar17 == 0) {
              zip->bzstream_valid = 0;
              uVar29 = 1;
              goto LAB_00660ccc;
            }
            pcVar21 = "Failed to clean up decompressor";
          }
          else {
            pcVar21 = "bzip decompression failed";
          }
LAB_0066145c:
          iVar17 = -1;
          goto LAB_00661474;
        }
        if (uVar33 < 5 && uVar32 != 0) {
          if (zip->odd_bcj_size == 0) goto LAB_00660913;
          uVar18 = zip->folder_outbytes_remaining;
          bVar39 = false;
          sVar31 = 0;
          bVar38 = false;
          uVar23 = 0;
        }
        else {
          if (uVar33 != 0 && zip->odd_bcj_size != 0) {
            lVar22 = 0;
            do {
              puVar9[lVar22] = zip->odd_bcj[lVar22];
              lVar25 = lVar22 + 1;
              psVar1 = &zip->odd_bcj_size;
              *psVar1 = *psVar1 - 1;
              if (*psVar1 == 0) break;
              bVar39 = uVar33 - 1 != lVar22;
              lVar22 = lVar25;
            } while (bVar39);
            puVar8 = puVar9 + lVar25;
            sVar40 = uVar33 - lVar25;
          }
LAB_00660913:
          if ((uVar32 != 0) && (sVar40 != 0)) {
            uVar11 = zip->codec2;
            goto LAB_0066092c;
          }
          uVar4 = (uint)(uVar32 == 0);
          uVar23 = uVar33 - sVar40;
          sVar31 = 0;
LAB_00660db6:
          uVar18 = zip->folder_outbytes_remaining;
          if (uVar18 <= uVar23) {
            uVar23 = uVar18;
          }
          bVar38 = uVar4 != 0;
          puVar2 = &zip->pack_stream_inbytes_remaining;
          *puVar2 = *puVar2 - sVar31;
          bVar39 = *puVar2 == 0;
          sVar37 = zip->uncompressed_buffer_size;
          sVar34 = zip->uncompressed_buffer_bytes_remaining;
        }
        zip->folder_outbytes_remaining = uVar18 - uVar23;
        uVar32 = sVar34 + uVar23;
        zip->uncompressed_buffer_bytes_remaining = uVar32;
        zip->pack_stream_bytes_unconsumed = sVar31;
        if (((uVar32 == sVar37) ||
            ((zip->codec2 == 0x3030103 && (sVar37 < uVar32 + 5 && zip->odd_bcj_size != 0)))) ||
           ((bool)(bVar39 & uVar18 == uVar23))) {
          if (local_78 <= uVar32) {
            zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
            return 0;
          }
LAB_00661452:
          pcVar21 = "Damaged 7-Zip archive";
          goto LAB_0066145c;
        }
        if ((bool)(bVar38 | (uVar23 == 0 && sVar31 == 0))) goto LAB_00661452;
        read_consume(a);
        __src = (Bytef *)__archive_read_ahead(a,1,(ssize_t *)&local_e0);
      } while (0 < (long)local_e0);
    }
  }
  pcVar21 = "Truncated 7-Zip file body";
LAB_00661441:
  iVar17 = 0x54;
LAB_00661474:
  archive_set_error(&a->archive,iVar17,pcVar21);
  return -0x1e;
}

Assistant:

static ssize_t
extract_pack_stream(struct archive_read *a, size_t minimum)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	ssize_t bytes_avail;
	int r;

	if (zip->codec == _7Z_COPY && zip->codec2 == (unsigned long)-1) {
		if (minimum == 0)
			minimum = 1;
		if (__archive_read_ahead(a, minimum, &bytes_avail) == NULL
		    || bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}
		if ((uint64_t)bytes_avail > zip->pack_stream_inbytes_remaining)
			bytes_avail = (ssize_t)zip->pack_stream_inbytes_remaining;
		zip->pack_stream_inbytes_remaining -= bytes_avail;
		if ((uint64_t)bytes_avail > zip->folder_outbytes_remaining)
			bytes_avail = (ssize_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_avail;
		zip->uncompressed_buffer_bytes_remaining = bytes_avail;
		return (ARCHIVE_OK);
	}

	/* If the buffer hasn't been allocated, allocate it now. */
	if (zip->uncompressed_buffer == NULL) {
		zip->uncompressed_buffer_size = UBUFF_SIZE;
		if (zip->uncompressed_buffer_size < minimum) {
			zip->uncompressed_buffer_size = minimum + 1023;
			zip->uncompressed_buffer_size &= ~0x3ff;
		}
		zip->uncompressed_buffer =
		    malloc(zip->uncompressed_buffer_size);
		if (zip->uncompressed_buffer == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "No memory for 7-Zip decompression");
			return (ARCHIVE_FATAL);
		}
		zip->uncompressed_buffer_bytes_remaining = 0;
	} else if (zip->uncompressed_buffer_size < minimum ||
	    zip->uncompressed_buffer_bytes_remaining < minimum) {
		/*
		 * Make sure the uncompressed buffer can have bytes
		 * at least `minimum' bytes.
		 * NOTE: This case happen when reading the header.
		 */
		size_t used;
		if (zip->uncompressed_buffer_pointer != 0)
			used = zip->uncompressed_buffer_pointer -
				zip->uncompressed_buffer;
		else
			used = 0;
		if (zip->uncompressed_buffer_size < minimum) {
			/*
			 * Expand the uncompressed buffer up to
			 * the minimum size.
			 */
			void *p;
			size_t new_size;

			new_size = minimum + 1023;
			new_size &= ~0x3ff;
			p = realloc(zip->uncompressed_buffer, new_size);
			if (p == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "No memory for 7-Zip decompression");
				return (ARCHIVE_FATAL);
			}
			zip->uncompressed_buffer = (unsigned char *)p;
			zip->uncompressed_buffer_size = new_size;
		}
		/*
		 * Move unconsumed bytes to the head.
		 */
		if (used) {
			memmove(zip->uncompressed_buffer,
				zip->uncompressed_buffer + used,
				zip->uncompressed_buffer_bytes_remaining);
		}
	} else
		zip->uncompressed_buffer_bytes_remaining = 0;
	zip->uncompressed_buffer_pointer = NULL;
	for (;;) {
		size_t bytes_in, bytes_out;
		const void *buff_in;
		unsigned char *buff_out;
		int end_of_data;

		/*
		 * Note: '1' here is a performance optimization.
		 * Recall that the decompression layer returns a count of
		 * available bytes; asking for more than that forces the
		 * decompressor to combine reads by copying data.
		 */
		buff_in = __archive_read_ahead(a, 1, &bytes_avail);
		if (bytes_avail <= 0) {
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Truncated 7-Zip file body");
			return (ARCHIVE_FATAL);
		}

		buff_out = zip->uncompressed_buffer
			+ zip->uncompressed_buffer_bytes_remaining;
		bytes_out = zip->uncompressed_buffer_size
			- zip->uncompressed_buffer_bytes_remaining;
		bytes_in = bytes_avail;
		if (bytes_in > zip->pack_stream_inbytes_remaining)
			bytes_in = (size_t)zip->pack_stream_inbytes_remaining;
		/* Drive decompression. */
		r = decompress(a, zip, buff_out, &bytes_out,
			buff_in, &bytes_in);
		switch (r) {
		case ARCHIVE_OK:
			end_of_data = 0;
			break;
		case ARCHIVE_EOF:
			end_of_data = 1;
			break;
		default:
			return (ARCHIVE_FATAL);
		}
		zip->pack_stream_inbytes_remaining -= bytes_in;
		if (bytes_out > zip->folder_outbytes_remaining)
			bytes_out = (size_t)zip->folder_outbytes_remaining;
		zip->folder_outbytes_remaining -= bytes_out;
		zip->uncompressed_buffer_bytes_remaining += bytes_out;
		zip->pack_stream_bytes_unconsumed = bytes_in;

		/*
		 * Continue decompression until uncompressed_buffer is full.
		 */
		if (zip->uncompressed_buffer_bytes_remaining ==
		    zip->uncompressed_buffer_size)
			break;
		if (zip->codec2 == _7Z_X86 && zip->odd_bcj_size &&
		    zip->uncompressed_buffer_bytes_remaining + 5 >
		    zip->uncompressed_buffer_size)
			break;
		if (zip->pack_stream_inbytes_remaining == 0 &&
		    zip->folder_outbytes_remaining == 0)
			break;
		if (end_of_data || (bytes_in == 0 && bytes_out == 0)) {
			archive_set_error(&(a->archive),
			    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
			return (ARCHIVE_FATAL);
		}
		read_consume(a);
	}
	if (zip->uncompressed_buffer_bytes_remaining < minimum) {
		archive_set_error(&(a->archive),
		    ARCHIVE_ERRNO_MISC, "Damaged 7-Zip archive");
		return (ARCHIVE_FATAL);
	}
	zip->uncompressed_buffer_pointer = zip->uncompressed_buffer;
	return (ARCHIVE_OK);
}